

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

int chknode(chkctx *ctx,int level,node234_conflict *node,void *lowbound,void *highbound)

{
  node234_conflict *pnVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  
  uVar4 = 4;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    if (node->kids[uVar6] == (node234 *)0x0) {
      uVar4 = uVar6 & 0xffffffff;
      break;
    }
  }
  for (lVar8 = uVar4 - 4; lVar8 != 0; lVar8 = lVar8 + 1) {
    if (*(long *)(node->counts + lVar8 * 2) == 0) {
      if (*(int *)((long)node->elems + lVar8 * 4) != 0) {
        error("node %p: kids[%d] NULL but count[%d]=%d nonzero",node,(ulong)((int)lVar8 + 4));
      }
    }
    else {
      error("node %p: nkids=%d but kids[%d] non-NULL",node,uVar4,(ulong)((int)lVar8 + 4));
    }
  }
  uVar5 = 0;
  uVar6 = 3;
  do {
    if (uVar5 == 3) {
LAB_00102914:
      iVar2 = (int)uVar6;
      for (uVar5 = uVar6; uVar5 != 3; uVar5 = uVar5 + 1) {
        if (node->elems[uVar5] != (void *)0x0) {
          error("node %p: nelems=%d but elems[%d] non-NULL",node,uVar6,uVar5 & 0xffffffff);
        }
      }
      if (uVar4 == 0) {
        if (ctx->treedepth < 0) {
          ctx->treedepth = level;
        }
        else if (ctx->treedepth != level) {
          error("node %p: leaf at depth %d, previously seen depth %d",node,(ulong)(uint)level);
        }
      }
      else {
        uVar5 = (ulong)(iVar2 + 1);
        if (iVar2 == 0) {
          uVar5 = uVar6;
        }
        if ((int)uVar4 != (int)uVar5) {
          error("node %p: %d elems should mean %d kids but has %d",node,uVar6,uVar5,uVar4);
        }
      }
      if (iVar2 == 0) {
        error("node %p: no elems",node);
      }
      ctx->elemcount = ctx->elemcount + iVar2;
      if (cmp != (cmpfn234)0x0) {
        for (uVar5 = 0; uVar6 + 1 != uVar5; uVar5 = uVar5 + 1) {
          pvVar7 = lowbound;
          if (uVar5 != 0) {
            pvVar7 = node->elems[uVar5 - 1];
          }
          pvVar9 = highbound;
          if (uVar6 != uVar5) {
            pvVar9 = node->elems[uVar5];
          }
          if ((pvVar7 != (void *)0x0) && (pvVar9 != (void *)0x0)) {
            iVar2 = (*cmp)(pvVar7,pvVar9);
            if (-1 < iVar2) {
              error("node %p: kid comparison [%d=%s,%d=%s] failed",node,(ulong)((int)uVar5 - 1),
                    pvVar7,uVar5 & 0xffffffff,pvVar9);
            }
          }
        }
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        pnVar1 = node->kids[uVar5]->parent;
        if (pnVar1 != node) {
          error("node %p kid %d: parent ptr is %p not %p",node,uVar5 & 0xffffffff,pnVar1,node);
        }
      }
      uVar5 = uVar6;
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        pvVar7 = lowbound;
        if (uVar10 != 0) {
          pvVar7 = node->elems[uVar10 - 1];
        }
        pvVar9 = highbound;
        if (uVar10 < uVar6) {
          pvVar9 = node->elems[uVar10];
        }
        uVar3 = chknode(ctx,level + 1,node->kids[uVar10],pvVar7,pvVar9);
        if (node->counts[uVar10] != uVar3) {
          error("node %p kid %d: count says %d, subtree really has %d",node,uVar10 & 0xffffffff,
                (ulong)(uint)node->counts[uVar10],(ulong)uVar3);
        }
        uVar5 = (ulong)((int)uVar5 + uVar3);
      }
      return (int)uVar5;
    }
    if (node->elems[uVar5] == (void *)0x0) {
      uVar6 = uVar5 & 0xffffffff;
      goto LAB_00102914;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int chknode(chkctx * ctx, int level, node234 * node,
            void *lowbound, void *highbound)
{
    int nkids, nelems;
    int i;
    int count;

    /* Count the non-NULL kids. */
    for (nkids = 0; nkids < 4 && node->kids[nkids]; nkids++);
    /* Ensure no kids beyond the first NULL are non-NULL. */
    for (i = nkids; i < 4; i++)
        if (node->kids[i]) {
            error("node %p: nkids=%d but kids[%d] non-NULL",
                  node, nkids, i);
        } else if (node->counts[i]) {
            error("node %p: kids[%d] NULL but count[%d]=%d nonzero",
                  node, i, i, node->counts[i]);
        }

    /* Count the non-NULL elements. */
    for (nelems = 0; nelems < 3 && node->elems[nelems]; nelems++);
    /* Ensure no elements beyond the first NULL are non-NULL. */
    for (i = nelems; i < 3; i++)
        if (node->elems[i]) {
            error("node %p: nelems=%d but elems[%d] non-NULL",
                  node, nelems, i);
        }

    if (nkids == 0) {
        /*
         * If nkids==0, this is a leaf node; verify that the tree
         * depth is the same everywhere.
         */
        if (ctx->treedepth < 0)
            ctx->treedepth = level;    /* we didn't know the depth yet */
        else if (ctx->treedepth != level)
            error("node %p: leaf at depth %d, previously seen depth %d",
                  node, level, ctx->treedepth);
    } else {
        /*
         * If nkids != 0, then it should be nelems+1, unless nelems
         * is 0 in which case nkids should also be 0 (and so we
         * shouldn't be in this condition at all).
         */
        int shouldkids = (nelems ? nelems + 1 : 0);
        if (nkids != shouldkids) {
            error("node %p: %d elems should mean %d kids but has %d",
                  node, nelems, shouldkids, nkids);
        }
    }

    /*
     * nelems should be at least 1.
     */
    if (nelems == 0) {
        error("node %p: no elems", node);
    }

    /*
     * Add nelems to the running element count of the whole tree.
     */
    ctx->elemcount += nelems;

    /*
     * Check ordering property: all elements should be strictly >
     * lowbound, strictly < highbound, and strictly < each other in
     * sequence. (lowbound and highbound are NULL at edges of tree
     * - both NULL at root node - and NULL is considered to be <
     * everything and > everything. IYSWIM.)
     */
    if (cmp) {
        for (i = -1; i < nelems; i++) {
            void *lower = (i == -1 ? lowbound : node->elems[i]);
            void *higher =
                (i + 1 == nelems ? highbound : node->elems[i + 1]);
            if (lower && higher && cmp(lower, higher) >= 0) {
                error("node %p: kid comparison [%d=%s,%d=%s] failed",
                      node, i, (char *)lower, i + 1, (char *)higher);
            }
        }
    }

    /*
     * Check parent pointers: all non-NULL kids should have a
     * parent pointer coming back to this node.
     */
    for (i = 0; i < nkids; i++)
        if (node->kids[i]->parent != node) {
            error("node %p kid %d: parent ptr is %p not %p",
                  node, i, node->kids[i]->parent, node);
        }


    /*
     * Now (finally!) recurse into subtrees.
     */
    count = nelems;

    for (i = 0; i < nkids; i++) {
        void *lower = (i == 0 ? lowbound : node->elems[i - 1]);
        void *higher = (i >= nelems ? highbound : node->elems[i]);
        int subcount =
            chknode(ctx, level + 1, node->kids[i], lower, higher);
        if (node->counts[i] != subcount) {
            error("node %p kid %d: count says %d, subtree really has %d",
                  node, i, node->counts[i], subcount);
        }
        count += subcount;
    }

    return count;
}